

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityKirchhoffGeneric::ComputeStress
          (ChElasticityKirchhoffGeneric *this,ChVector<double> *n,ChVector<double> *m,
          ChVector<double> *eps,ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  undefined8 ***pppuVar1;
  uint uVar2;
  Index row;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  ChVectorN<double,_6> mstrain;
  type tmp;
  ChVectorN<double,_6> mstress;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined8 ****local_a8 [6];
  undefined8 local_78;
  undefined8 ***local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 **ppuStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar2 = -((uint)((ulong)&local_d8 >> 3) & 0x1fffffff) & 6;
  uVar4 = 3;
  if (uVar2 < 3) {
    uVar4 = uVar2;
  }
  if (uVar2 != 0) {
    memcpy(&local_d8,eps,(ulong)(uVar4 * 8));
  }
  if (uVar4 != 3) {
    uVar5 = (ulong)(uVar4 << 3);
    memcpy((void *)((long)&local_d8 + uVar5),(void *)((long)eps->m_data + uVar5),0x18 - uVar5);
  }
  memcpy(&dStack_c0,kur,0);
  memcpy(&dStack_c0,kur,0x18);
  pdVar6 = (this->mE).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array + 4;
  lVar3 = 0;
  do {
    dVar7 = local_d8 * ((plain_array<double,_36,_1,_32> *)(pdVar6 + -4))->array[0] +
            local_c8 * pdVar6[-2] + local_b8 * *pdVar6;
    dVar9 = dStack_d0 * pdVar6[-3] + dStack_c0 * pdVar6[-1] + dStack_b0 * pdVar6[1];
    auVar8._0_8_ = dVar7 + dVar9;
    auVar8._8_8_ = dVar7 + dVar9;
    pppuVar1 = (undefined8 ***)vmovlpd_avx(auVar8);
    local_a8[lVar3] = (undefined8 ****)pppuVar1;
    lVar3 = lVar3 + 1;
    pdVar6 = pdVar6 + 6;
  } while (lVar3 != 6);
  local_68 = local_a8[0];
  uStack_60 = local_a8[1];
  local_58 = local_a8[2];
  ppuStack_50 = local_a8[3];
  uStack_48 = local_a8[4];
  uStack_40 = local_a8[5];
  local_a8[1] = (undefined8 ****)0x3;
  local_a8[4] = (undefined8 ****)0x0;
  local_78 = 6;
  local_a8[0] = &local_68;
  local_a8[3] = &local_68;
  ChVector<double>::operator=
            (n,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               local_a8);
  local_a8[0] = (undefined8 ****)&ppuStack_50;
  local_a8[1] = (undefined8 ****)0x3;
  local_a8[4] = (undefined8 ****)0x3;
  local_78 = 6;
  local_a8[3] = &local_68;
  ChVector<double>::operator=
            (m,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               local_a8);
  return;
}

Assistant:

void ChElasticityKirchhoffGeneric::ComputeStress(
	ChVector<>& n,            ///< forces  n_11, n_22, n_12 (per unit length)
	ChVector<>& m,            ///< torques m_11, m_22, m_12 (per unit length)
	const ChVector<>& eps,    ///< strains   e_11, e_22, e_12
	const ChVector<>& kur,    ///< curvature k_11, k_22, k_12
	const double z_inf,       ///< layer lower z value (along thickness coord)
	const double z_sup,       ///< layer upper z value (along thickness coord)
	const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
) {
	ChVectorN<double, 6> mstrain;
    ChVectorN<double, 6> mstress;
    mstrain.segment(0 , 3) = eps.eigen();
    mstrain.segment(3 , 3) = kur.eigen();
    mstress = this->mE * mstrain;
    n = mstress.segment(0, 3);
    m = mstress.segment(3, 3);
}